

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void sync_globals(TCGContext_conflict9 *s,TCGRegSet allocated_regs)

{
  TCGTemp *ts;
  int local_18;
  int n;
  int i;
  TCGRegSet allocated_regs_local;
  TCGContext_conflict9 *s_local;
  
  local_18 = 0;
  for (; local_18 < s->nb_globals; local_18 = local_18 + 1) {
  }
  return;
}

Assistant:

static void sync_globals(TCGContext *s, TCGRegSet allocated_regs)
{
    int i, n;

    for (i = 0, n = s->nb_globals; i < n; i++) {
        TCGTemp *ts = &s->temps[i];
        tcg_debug_assert(ts->val_type != TEMP_VAL_REG
                         || ts->fixed_reg
                         || ts->mem_coherent);
    }
}